

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Vec_Int_t * Abc_NtkFinComputeObjects(Vec_Int_t *vPairs,Vec_Wec_t **pvMap,int nObjs)

{
  int iVar1;
  int *piVar2;
  int nCapMin;
  int iVar3;
  Vec_Int_t *p;
  Vec_Wec_t *pVVar4;
  Vec_Int_t *p_00;
  long lVar5;
  Vec_Wec_t **ppVVar6;
  Vec_Wec_t **ppVVar7;
  long lVar8;
  int iVar9;
  
  ppVVar7 = pvMap;
  p = Vec_IntAlloc(100);
  pVVar4 = Vec_WecStart(nObjs);
  *pvMap = pVVar4;
  ppVVar6 = (Vec_Wec_t **)0x1;
  for (iVar9 = 3; iVar9 < vPairs->nSize; iVar9 = iVar9 + 2) {
    iVar3 = Vec_IntEntry(vPairs,iVar9 + -1);
    Vec_IntEntry(vPairs,iVar9);
    Vec_IntPush(p,iVar3);
    pVVar4 = *pvMap;
    if (pVVar4->nSize <= iVar3) {
      iVar1 = iVar3 + 1;
      nCapMin = pVVar4->nSize * 2;
      if (nCapMin <= iVar1) {
        nCapMin = iVar1;
      }
      Vec_WecGrow(pVVar4,nCapMin);
      pVVar4->nSize = iVar1;
    }
    p_00 = Vec_WecEntry(pVVar4,iVar3);
    ppVVar7 = ppVVar6;
    Vec_IntPush(p_00,(int)ppVVar6);
    ppVVar6 = (Vec_Wec_t **)(ulong)((int)ppVVar6 + 1);
  }
  iVar9 = p->nSize;
  if (1 < (long)iVar9) {
    Vec_IntSort(p,(int)ppVVar7);
    iVar3 = 1;
    for (lVar5 = 1; iVar9 != lVar5; lVar5 = lVar5 + 1) {
      piVar2 = p->pArray;
      if (piVar2[lVar5] != piVar2[lVar5 + -1]) {
        lVar8 = (long)iVar3;
        iVar3 = iVar3 + 1;
        piVar2[lVar8] = piVar2[lVar5];
      }
    }
    p->nSize = iVar3;
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFinComputeObjects( Vec_Int_t * vPairs, Vec_Wec_t ** pvMap, int nObjs )
{
    int i, iObj, Type;
    Vec_Int_t * vObjs = Vec_IntAlloc( 100 );
    *pvMap = Vec_WecStart( nObjs );
    Vec_IntForEachEntryDoubleStart( vPairs, iObj, Type, i, 2 )
    {
        Vec_IntPush( vObjs, iObj );
        Vec_WecPush( *pvMap, iObj, i/2 );
    }
    Vec_IntUniqify( vObjs );
    return vObjs;
}